

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::ConstPlusRegPattern::TryToGenerateCode
          (ConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstBinopPtr pCVar1;
  AssemblyCommands *this_00;
  ChildrenTemps *pCVar2;
  TOperationType TVar3;
  CExpression *pCVar4;
  CTempExpression *local_140;
  ConstTempPtr local_130;
  CBinopExpression *local_120;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  CExpression *local_e8;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_e0;
  pair<IRT::CTemp,_const_IRT::INode_*> local_b8;
  undefined1 local_90 [8];
  CTemp rightRegister;
  undefined1 local_60 [24];
  ConstTempPtr rightRegisterPtr;
  ConstConstPtr constPtr;
  ConstBinopPtr binopPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  ConstPlusRegPattern *this_local;
  
  binopPtr = (ConstBinopPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_120 = (CBinopExpression *)0x0;
  }
  else {
    local_120 = (CBinopExpression *)
                __dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
  }
  constPtr = (ConstConstPtr)local_120;
  if ((local_120 != (CBinopExpression *)0x0) &&
     (TVar3 = CBinopExpression::getOperation(local_120), TVar3 == PLUS)) {
    pCVar4 = CBinopExpression::getLeftOperand((CBinopExpression *)constPtr);
    if (pCVar4 == (CExpression *)0x0) {
      local_130 = (ConstTempPtr)0x0;
    }
    else {
      local_130 = (ConstTempPtr)
                  __dynamic_cast(pCVar4,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
    }
    rightRegisterPtr = local_130;
    if (local_130 != (ConstTempPtr)0x0) {
      pCVar4 = CBinopExpression::getRightOperand((CBinopExpression *)constPtr);
      if (pCVar4 == (CExpression *)0x0) {
        local_140 = (CTempExpression *)0x0;
      }
      else {
        local_140 = (CTempExpression *)
                    __dynamic_cast(pCVar4,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      pCVar2 = children_local;
      pCVar1 = binopPtr;
      local_60._16_8_ = local_140;
      if (local_140 == (CTempExpression *)0x0) {
        CTemp::CTemp((CTemp *)local_90);
        this_00 = commands_local;
        local_e8 = CBinopExpression::getLeftOperand((CBinopExpression *)constPtr);
        std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_e0,(CTemp *)local_90,&local_e8);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_b8,&local_e0);
        std::
        vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
        ::push_back((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                     *)this_00,&local_b8);
        std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_b8);
        std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_e0);
        pCVar1 = binopPtr;
        std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp&>
                  ((CTemp *)local_f8,(CTemp *)children_local);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)pCVar1,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_f8);
        std::shared_ptr<AssemblyCode::MoveRegRegCommand>::~shared_ptr
                  ((shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_f8);
        CTemp::~CTemp((CTemp *)local_90);
      }
      else {
        CTempExpression::getTemprorary(local_140);
        std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                  ((CTemp *)local_60,(CTemp *)pCVar2);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)pCVar1,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_60);
        std::shared_ptr<AssemblyCode::MoveRegRegCommand>::~shared_ptr
                  ((shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_60);
      }
      pCVar2 = children_local;
      pCVar1 = binopPtr;
      CConstExpression::getValue((CConstExpression *)rightRegisterPtr);
      std::make_shared<AssemblyCode::AddRegConstCommand,IRT::CTemp_const&,int>
                ((CTemp *)local_108,(int *)pCVar2);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::AddRegConstCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::AddRegConstCommand> *)local_108);
      std::shared_ptr<AssemblyCode::AddRegConstCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::AddRegConstCommand> *)local_108);
      return true;
    }
  }
  return false;
}

Assistant:

bool
IRT::ConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                             AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::PLUS ) {
        ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getLeftOperand( ));
        if ( constPtr ) {
            ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
            if ( rightRegisterPtr ) {
                commands.emplace_back(
                        std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
            } else {
                CTemp rightRegister;
                children.push_back( std::make_pair( rightRegister, binopPtr->getLeftOperand( )));
                commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegister ));
            }
            commands.emplace_back( std::make_shared<AssemblyCode::AddRegConstCommand>( dest, constPtr->getValue( )));
            return true;
        }
    }
    return false;
}